

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

CAmount GetBlockSubsidy(int nHeight,Params *consensusParams)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  lVar1 = (long)nHeight / (long)consensusParams->nSubsidyHalvingInterval;
  uVar2 = 0;
  if ((int)lVar1 < 0x40) {
    uVar2 = 5000000000 >> ((byte)lVar1 & 0x3f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

CAmount GetBlockSubsidy(int nHeight, const Consensus::Params& consensusParams)
{
    int halvings = nHeight / consensusParams.nSubsidyHalvingInterval;
    // Force block reward to zero when right shift is undefined.
    if (halvings >= 64)
        return 0;

    CAmount nSubsidy = 50 * COIN;
    // Subsidy is cut in half every 210,000 blocks which will occur approximately every 4 years.
    nSubsidy >>= halvings;
    return nSubsidy;
}